

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

bool __thiscall MathInterpreter::isNumber(MathInterpreter *this,string *s)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar3;
  if (cVar1 < ':') {
    if (cVar1 != '-' && cVar1 < '0') {
      return false;
    }
  }
  else if (0x19 < (byte)(cVar1 + 0xbfU)) {
    return false;
  }
  uVar4 = s->_M_string_length;
  uVar5 = 0;
  uVar6 = 1;
  while (((uVar7 = (ulong)uVar6, uVar7 < uVar4 && (cVar2 = pcVar3[uVar7], cVar2 < ':')) &&
         ('/' < cVar2 || cVar2 == '.'))) {
    uVar5 = uVar5 + (cVar2 == '.');
    uVar6 = uVar6 + 1;
  }
  if (uVar4 < 2) {
    if (cVar1 == '-') {
      return false;
    }
  }
  else if ((cVar1 == '-') && (pcVar3[1] == '.')) {
    return false;
  }
  if ((uVar4 == uVar7) && (uVar5 < 2)) {
    return true;
  }
  return false;
}

Assistant:

bool MathInterpreter::isNumber(string s) {
  unsigned int i = 1, count = 0;
  if (((s[0] <= '9') && (s[0] >= '0')) || ((s[0] <= 'Z') && (s[0] >= 'A'))
      || (s[0] == '-')) {
    while ((i < s.size())
        && (((s[i] <= '9') && (s[i] >= '0')) || (s[i] == '.'))) {
      if (s[i] == '.') {
        count++;
      }
      i++;
    }
    if (((s.size() >= 2) && (!((s[0] == '-') && (s[1] == '.'))))
        || ((s.size() < 2) && (!(s[0] == '-')))) {
      if ((i == s.size()) && (count <= 1)) {
        return true;
      }
    }
  }
  return false;
}